

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

bool CoreML::hasValidQuantizationParams(WeightParams *weight,int expectSize)

{
  int iVar1;
  int iVar2;
  QuantizationParams *pQVar3;
  
  pQVar3 = weight->quantization_;
  if ((pQVar3 != (QuantizationParams *)0x0 &&
       weight != (WeightParams *)Specification::_WeightParams_default_instance_) &&
     (pQVar3->numberofbits_ - 1 < 8)) {
    if (pQVar3->_oneof_case_[0] == 0x66) {
      if ((((pQVar3->QuantizationType_).linearquantization_)->scale_).current_size_ ==
          1 << ((byte)pQVar3->numberofbits_ & 0x1f)) {
        return true;
      }
    }
    else if (pQVar3->_oneof_case_[0] == 0x65) {
      iVar1 = (((pQVar3->QuantizationType_).linearquantization_)->scale_).current_size_;
      if ((iVar1 == 1 || iVar1 == expectSize) &&
         (iVar2 = (((pQVar3->QuantizationType_).linearquantization_)->bias_).current_size_,
         iVar2 == iVar1 || iVar2 == 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool WeightParams::_internal_has_quantization() const {
  return this != internal_default_instance() && quantization_ != nullptr;
}